

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjpeg.c
# Opt level: O0

opj_bool opj_setup_decoder_v2
                   (opj_codec_t *p_info,opj_dparameters_t *parameters,opj_event_mgr_t *event_mgr)

{
  opj_event_mgr_t *in_RDX;
  long in_RSI;
  long in_RDI;
  opj_codec_private_t *l_info;
  opj_bool local_4;
  
  if (((in_RDI == 0) || (in_RSI == 0)) || (in_RDX == (opj_event_mgr_t *)0x0)) {
    fprintf(_stderr,"[ERROR] Input parameters of the setup_decoder function are incorrect.\n");
    local_4 = 0;
  }
  else if (((in_RDX->error_handler == (opj_msg_callback)0x0) ||
           (in_RDX->warning_handler == (opj_msg_callback)0x0)) ||
          (in_RDX->error_handler == (opj_msg_callback)0x0)) {
    fprintf(_stderr,"[ERROR] Event handler provided to the setup_decoder function is not valid.\n");
    local_4 = 0;
  }
  else if (*(int *)(in_RDI + 0x60) == 0) {
    opj_event_msg_v2(in_RDX,1,
                     "Codec provided to the setup_decoder function is not a decompressor handler.\n"
                    );
    local_4 = 0;
  }
  else {
    (**(code **)(in_RDI + 0x30))(*(undefined8 *)(in_RDI + 0x50),in_RSI);
    *(opj_event_mgr_t **)(in_RDI + 0x58) = in_RDX;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

opj_bool OPJ_CALLCONV opj_setup_decoder_v2(opj_codec_t *p_info, opj_dparameters_t *parameters, opj_event_mgr_t* event_mgr)
{
	opj_codec_private_t * l_info = (opj_codec_private_t *) p_info;

	if ( !p_info || !parameters || !event_mgr ){
		fprintf(stderr, "[ERROR] Input parameters of the setup_decoder function are incorrect.\n");
		return OPJ_FALSE;
	}

	if ( !event_mgr->error_handler || !event_mgr->warning_handler || !event_mgr->error_handler){
		fprintf(stderr, "[ERROR] Event handler provided to the setup_decoder function is not valid.\n");
		return OPJ_FALSE;
	}

	if (! l_info->is_decompressor) {
		opj_event_msg_v2(event_mgr, EVT_ERROR, "Codec provided to the setup_decoder function is not a decompressor handler.\n");
		return OPJ_FALSE;
	}

	l_info->m_codec_data.m_decompression.opj_setup_decoder(l_info->m_codec, parameters);

	l_info->m_event_mgr = event_mgr;

	return OPJ_TRUE;
}